

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_AActor_A_Overlay(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  undefined8 *puVar1;
  AActor *caller;
  player_t *this;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  undefined4 extraout_var_00;
  FState *newstate;
  DPSprite *pDVar8;
  int pos;
  char *pcVar9;
  bool bVar10;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_0043cd32:
      pcVar9 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0043cd85;
    }
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar1 != (undefined8 *)0x0) {
      if (puVar1[1] == 0) {
        uVar6 = (**(code **)*puVar1)(puVar1);
        puVar1[1] = uVar6;
      }
      pPVar7 = (PClass *)puVar1[1];
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar2 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar2) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar10) {
        pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0043cd85;
      }
    }
    pPVar2 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0043cd32;
      caller = (AActor *)param[1].field_0.field_1.a;
      if (caller != (AActor *)0x0) {
        if ((caller->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
          (caller->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar7 = (caller->super_DThinker).super_DObject.Class;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar2 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar2) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043cd85;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              iVar3 = param[3].field_0.i;
              if (numparam < 5) {
                if (defaultparam->Array[4].field_0.field_3.Type != '\0') {
                  pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_0043cdcc;
                }
                pos = defaultparam->Array[4].field_0.i;
              }
              else {
                if (param[4].field_0.field_3.Type != '\0') {
                  pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_0043cdcc:
                  __assert_fail(pcVar9,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                                ,0x51b,
                                "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pos = param[4].field_0.i;
              }
              if ((caller->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                iVar4 = (**(caller->super_DThinker).super_DObject._vptr_DObject)(caller);
                (caller->super_DThinker).super_DObject.Class =
                     (PClass *)CONCAT44(extraout_var_00,iVar4);
              }
              newstate = FStateLabelStorage::GetState
                                   (&StateLabels,pos,
                                    (PClassActor *)(caller->super_DThinker).super_DObject.Class,
                                    false);
              if (numparam < 6) {
                param = defaultparam->Array;
                if (param[5].field_0.field_3.Type != '\0') {
                  pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_0043cdeb;
                }
              }
              else if (param[5].field_0.field_3.Type != '\0') {
                pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_0043cdeb:
                __assert_fail(pcVar9,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                              ,0x51c,
                              "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              this = (player_t *)puVar1[0x46];
              if ((this == (player_t *)0x0) ||
                 ((param[5].field_0.i != 0 &&
                  (pDVar8 = player_t::FindPSprite(this,iVar3), pDVar8 != (DPSprite *)0x0)))) {
                if (numret < 1) {
                  return 0;
                }
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                                ,0x522,
                                "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                uVar5 = 0;
              }
              else {
                pDVar8 = (DPSprite *)
                         M_Malloc_Dbg(0x88,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                      ,0x1f9);
                DPSprite::DPSprite(pDVar8,this,caller,iVar3);
                DPSprite::SetState(pDVar8,newstate,false);
                if (numret < 1) {
                  return 0;
                }
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                                ,0x528,
                                "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                uVar5 = 1;
              }
              if (ret->RegType == '\0') {
                *(undefined4 *)ret->Location = uVar5;
                return 1;
              }
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            pcVar9 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                        ,0x51a,
                        "int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_0043cd85;
      }
    }
  }
  pcVar9 = "(paramnum) < numparam";
LAB_0043cd85:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x519,"int AF_AActor_A_Overlay(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Overlay)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_INT		(layer);
	PARAM_STATE_ACTION_DEF(state);
	PARAM_BOOL_DEF(dontoverride);

	player_t *player = self->player;

	if (player == nullptr || (dontoverride && (player->FindPSprite(layer) != nullptr)))
	{
		ACTION_RETURN_BOOL(false);
	}

	DPSprite *pspr;
	pspr = new DPSprite(player, stateowner, layer);
	pspr->SetState(state);
	ACTION_RETURN_BOOL(true);
}